

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O3

ssize_t __thiscall QIODevice::read(QIODevice *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  uint uVar2;
  QIODevicePrivate *this_00;
  QRingBuffer *pQVar3;
  QRingChunk *pQVar4;
  int iVar5;
  ssize_t sVar6;
  char *pcVar7;
  AccessMode AVar8;
  undefined4 in_register_00000034;
  
  this_00 = (QIODevicePrivate *)(this->super_QObject).d_ptr.d;
  uVar2 = (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
          super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  if ((uVar2 & 1) == 0) {
    if (uVar2 == 0) {
      pcVar7 = "device not open";
    }
    else {
      pcVar7 = "WriteOnly device";
    }
  }
  else {
    AVar8 = this_00->accessMode;
    if (AVar8 == Unset) {
      iVar5 = (*((this_00->super_QObjectPrivate).super_QObjectData.q_ptr)->_vptr_QObject[0xc])();
      AVar8 = RandomAccess - (char)iVar5;
      this_00->accessMode = AVar8;
    }
    if (__buf == (void *)0x1) {
      if ((AVar8 == Sequential) && (this_00->transactionStarted != false)) goto LAB_002434d0;
      while ((pQVar3 = (this_00->buffer).m_buf, pQVar3 != (QRingBuffer *)0x0 &&
             (pQVar3->bufferSize != 0))) {
        pQVar4 = (pQVar3->buffers).d.ptr;
        pcVar7 = (pQVar4->chunk).d.ptr;
        if (pcVar7 == (char *)0x0) {
          pcVar7 = &QByteArray::_empty;
        }
        cVar1 = pcVar7[pQVar4->headOffset];
        QRingBuffer::free(pQVar3,(void *)0x1);
        if (AVar8 != Sequential) {
          this_00->pos = this_00->pos + 1;
        }
        if ((cVar1 != '\r') ||
           (((this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x10) == 0)) {
          *(char *)CONCAT44(in_register_00000034,__fd) = cVar1;
          pQVar3 = (this_00->buffer).m_buf;
          if ((pQVar3 != (QRingBuffer *)0x0) && (pQVar3->bufferSize != 0)) {
            return 1;
          }
          (*(this->super_QObject)._vptr_QObject[0x19])
                    (this,(char *)CONCAT44(in_register_00000034,__fd),0);
          return 1;
        }
      }
    }
    if (-1 < (long)__buf) {
LAB_002434d0:
      sVar6 = QIODevicePrivate::read(this_00,__fd,__buf,0);
      return sVar6;
    }
    pcVar7 = "Called with maxSize < 0";
  }
  checkWarnMessage(this,"read",pcVar7);
  return -1;
}

Assistant:

qint64 QIODevice::read(char *data, qint64 maxSize)
{
    Q_D(QIODevice);
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::read(%p, %lld), d->pos = %lld, d->buffer.size() = %lld\n",
           this, data, maxSize, d->pos, d->buffer.size());
#endif

    CHECK_READABLE(read, qint64(-1));
    const bool sequential = d->isSequential();

    // Short-cut for getChar(), unless we need to keep the data in the buffer.
    if (maxSize == 1 && !(sequential && d->transactionStarted)) {
        int chint;
        while ((chint = d->buffer.getChar()) != -1) {
            if (!sequential)
                ++d->pos;

            char c = char(uchar(chint));
            if (c == '\r' && (d->openMode & Text))
                continue;
            *data = c;
#if defined QIODEVICE_DEBUG
            printf("%p \tread 0x%hhx (%c) returning 1 (shortcut)\n", this,
                   int(c), isAsciiPrintable(c) ? c : '?');
#endif
            if (d->buffer.isEmpty())
                readData(data, 0);
            return qint64(1);
        }
    }

    CHECK_MAXLEN(read, qint64(-1));
    const qint64 readBytes = d->read(data, maxSize);

#if defined QIODEVICE_DEBUG
    printf("%p \treturning %lld, d->pos == %lld, d->buffer.size() == %lld\n", this,
           readBytes, d->pos, d->buffer.size());
    if (readBytes > 0)
        debugBinaryString(data - readBytes, readBytes);
#endif

    return readBytes;
}